

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_table.cpp
# Opt level: O2

ColumnDefinition * __thiscall
duckdb::Transformer::TransformColumnDefinition
          (ColumnDefinition *__return_storage_ptr__,Transformer *this,PGColumnDef *cdef)

{
  ColumnCategory CVar1;
  PGTypeName *type_name;
  ParserException *pPVar2;
  Transformer *this_00;
  allocator local_d1;
  string local_d0;
  LogicalType target_type;
  LogicalType local_98;
  string name;
  string local_60;
  string local_40;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  if (cdef->colname != (char *)0x0) {
    ::std::__cxx11::string::assign((char *)&name);
  }
  CVar1 = cdef->category;
  LogicalType::LogicalType(&target_type);
  type_name = cdef->typeName;
  if (type_name == (PGTypeName *)0x0 && CVar1 == COL_GENERATED) {
    LogicalType::LogicalType((LogicalType *)&local_d0,ANY);
  }
  else if (type_name == (PGTypeName *)0x0) {
    LogicalType::LogicalType((LogicalType *)&local_d0,UNKNOWN);
  }
  else {
    TransformTypeName((LogicalType *)&local_d0,this,type_name);
  }
  this_00 = (Transformer *)&local_d0;
  LogicalType::operator=(&target_type,(LogicalType *)&local_d0);
  LogicalType::~LogicalType((LogicalType *)&local_d0);
  if (cdef->collClause != (PGCollateClause *)0x0) {
    if (cdef->category == COL_GENERATED) {
      pPVar2 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_d0,"Collations are not supported on generated columns",&local_d1);
      ParserException::ParserException(pPVar2,&local_d0);
      __cxa_throw(pPVar2,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (target_type.id_ != VARCHAR) {
      pPVar2 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_d0,"Only VARCHAR columns can have collations!",&local_d1);
      ParserException::ParserException(pPVar2,&local_d0);
      __cxa_throw(pPVar2,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformCollation_abi_cxx11_(&local_40,this_00,cdef->collClause);
    LogicalType::VARCHAR_COLLATION((LogicalType *)&local_d0,(string *)&local_40);
    LogicalType::operator=(&target_type,(LogicalType *)&local_d0);
    LogicalType::~LogicalType((LogicalType *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  ::std::__cxx11::string::string((string *)&local_60,(string *)&name);
  LogicalType::LogicalType(&local_98,&target_type);
  ColumnDefinition::ColumnDefinition(__return_storage_ptr__,&local_60,&local_98);
  LogicalType::~LogicalType(&local_98);
  ::std::__cxx11::string::~string((string *)&local_60);
  LogicalType::~LogicalType(&target_type);
  ::std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

ColumnDefinition Transformer::TransformColumnDefinition(duckdb_libpgquery::PGColumnDef &cdef) {
	string name;
	if (cdef.colname) {
		name = cdef.colname;
	}

	auto optional_type = cdef.category == duckdb_libpgquery::COL_GENERATED;
	LogicalType target_type;
	if (optional_type && !cdef.typeName) {
		target_type = LogicalType::ANY;
	} else if (!cdef.typeName) {
		// ALTER TABLE tbl ALTER TYPE USING ...
		target_type = LogicalType::UNKNOWN;
	} else {
		target_type = TransformTypeName(*cdef.typeName);
	}

	if (cdef.collClause) {
		if (cdef.category == duckdb_libpgquery::COL_GENERATED) {
			throw ParserException("Collations are not supported on generated columns");
		}
		if (target_type.id() != LogicalTypeId::VARCHAR) {
			throw ParserException("Only VARCHAR columns can have collations!");
		}
		target_type = LogicalType::VARCHAR_COLLATION(TransformCollation(cdef.collClause));
	}

	return ColumnDefinition(name, target_type);
}